

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O1

void aes_cbc_sw_encrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  int iVar1;
  ssh_cipheralg *psVar2;
  ssh_cipheralg *psVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined8 *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint8_t *blk;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ssh_cipher *vout;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ssh_cipher *psVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint8_t *p;
  
  if (0 < blklen) {
    puVar13 = (undefined8 *)((long)blklen + (long)vblk);
    vout = ciph + -0xb;
    do {
      memxor16(vout,vout,vblk);
      iVar1 = *(int *)&ciph[-0xc].vt;
      psVar2 = ciph[-0xb].vt;
      psVar3 = ciph[-10].vt;
      uVar21 = (((ulong)psVar2 >> 7 ^ (ulong)*(uint7 *)&ciph[-0xb].vt) & 0xaa00aa00aa00aa) * 0x81 ^
               (ulong)psVar2;
      uVar17 = (((ulong)psVar3 >> 7 ^ (ulong)*(uint7 *)&ciph[-10].vt) & 0xaa00aa00aa00aa) * 0x81 ^
               (ulong)psVar3;
      uVar21 = ((uVar21 >> 0xe ^ uVar21) & 0xcccc0000cccc) * 0x4001 ^ uVar21;
      uVar17 = ((uVar17 >> 0xe ^ uVar17) & 0xcccc0000cccc) * 0x4001 ^ uVar17;
      uVar8 = (ulong)(((uint)(uVar21 >> 0x1c) ^ (uint)uVar21) & 0xf0f0f0f0);
      uVar21 = (uVar8 << 0x1c | uVar8) ^ uVar21;
      uVar8 = (ulong)(((uint)(uVar17 >> 0x1c) ^ (uint)uVar17) & 0xf0f0f0f0);
      uVar17 = (uVar8 << 0x1c | uVar8) ^ uVar17;
      uVar8 = (uVar21 >> 8 ^ uVar17) & 0xff00ff00ff00ff;
      uVar21 = uVar8 << 8 ^ uVar21;
      uVar8 = uVar8 ^ uVar17;
      uVar7 = (uint)(ushort)(*(ushort *)&ciph[-0x2a].vt ^ (ushort)uVar21);
      uVar38 = (uint)(ushort)(*(ushort *)((long)&ciph[-0x2a].vt + 2) ^ (ushort)uVar8);
      uVar28 = (uint)(ushort)((ushort)(uVar21 >> 0x10) ^ *(ushort *)((long)&ciph[-0x2a].vt + 4));
      uVar36 = (uint)(ushort)((ushort)(uVar8 >> 0x10) ^ *(ushort *)((long)&ciph[-0x2a].vt + 6));
      uVar4 = (ushort)(uVar21 >> 0x30);
      uVar39 = CONCAT22(uVar4,(ushort)(uVar21 >> 0x20) ^ *(ushort *)&ciph[-0x29].vt);
      uVar5 = (ushort)(uVar8 >> 0x30);
      uVar16 = CONCAT22(uVar5,(ushort)(uVar8 >> 0x20) ^ *(ushort *)((long)&ciph[-0x29].vt + 2));
      uVar22 = (uint)(uVar4 ^ *(ushort *)((long)&ciph[-0x29].vt + 4));
      uVar35 = (uint)(uVar5 ^ *(ushort *)((long)&ciph[-0x29].vt + 6));
      psVar27 = ciph + -0x28;
      while (iVar1 = iVar1 + -1, iVar1 != 0) {
        uVar6 = uVar39 ^ uVar28;
        uVar9 = uVar35 ^ uVar38;
        uVar16 = uVar16 ^ uVar22;
        uVar24 = uVar35 ^ uVar28;
        uVar10 = uVar16 ^ uVar7;
        uVar14 = uVar9 ^ uVar6;
        uVar38 = uVar38 ^ uVar10;
        uVar28 = uVar28 ^ uVar36 ^ uVar14;
        uVar22 = uVar36 ^ uVar14 ^ uVar22;
        uVar11 = uVar35 ^ uVar39;
        uVar12 = uVar28 ^ uVar16;
        uVar18 = uVar22 ^ uVar11;
        uVar36 = uVar12 & uVar24 ^ uVar18 & uVar11;
        uVar31 = (uVar12 ^ uVar18) & uVar6 ^ uVar18 & uVar11;
        uVar16 = uVar16 ^ uVar18;
        uVar23 = uVar22 ^ uVar28 & uVar14 ^ (uVar28 ^ uVar7) & (uVar38 ^ uVar24) ^ uVar31;
        uVar31 = uVar38 & uVar10 ^ uVar16 ^ uVar16 & uVar9 ^ uVar9 ^ uVar31;
        uVar15 = (uVar39 ^ uVar10) & uVar7 ^ uVar24 ^ uVar12 ^ uVar28 & uVar14 ^ uVar36;
        uVar36 = uVar16 & uVar9 ^ uVar35 ^ (uVar18 ^ uVar7) & (uVar10 ^ uVar35) ^ uVar16 ^ uVar36;
        uVar32 = uVar31 & uVar23;
        uVar23 = uVar23 ^ uVar15;
        uVar22 = (uVar36 ^ uVar32) & uVar23 ^ uVar15;
        uVar15 = (uVar15 ^ uVar32) & (uVar36 ^ uVar31);
        uVar29 = uVar15 ^ uVar36;
        uVar15 = (uVar15 ^ uVar32) & uVar36;
        uVar31 = uVar31 ^ uVar15;
        uVar23 = (uVar15 ^ uVar36 ^ uVar32) & uVar22 ^ uVar23;
        uVar19 = uVar31 ^ uVar29;
        uVar30 = uVar23 ^ uVar19;
        uVar20 = uVar19 & (uVar38 ^ uVar24);
        uVar33 = uVar22 ^ uVar29;
        uVar16 = uVar16 & (uVar23 ^ uVar22);
        uVar9 = (uVar23 ^ uVar22) & uVar9;
        uVar25 = (uVar18 ^ uVar7) & uVar22;
        uVar32 = (uVar12 ^ uVar18) & (uVar30 ^ uVar33);
        uVar6 = (uVar30 ^ uVar33) & uVar6;
        uVar36 = uVar23 & uVar38 ^ uVar25;
        uVar37 = uVar28 & uVar31 ^ uVar16;
        uVar38 = uVar9 ^ uVar7 & uVar29 ^ uVar37;
        uVar34 = uVar33 & uVar11 ^ uVar6;
        uVar15 = uVar38 ^ uVar36 ^ uVar34;
        uVar34 = uVar34 ^ uVar10 & uVar23;
        uVar16 = uVar18 & uVar33 ^ uVar16 ^ uVar32;
        uVar32 = uVar12 & uVar30 ^ uVar32 ^ uVar34;
        uVar34 = uVar34 ^ uVar20 ^ uVar31 & uVar14;
        uVar18 = uVar10 & uVar23 ^ uVar16;
        uVar11 = uVar22 & (uVar10 ^ uVar35) ^ uVar38 ^ uVar32;
        uVar35 = (uVar28 ^ uVar7) & uVar19 ^ uVar34;
        uVar34 = uVar34 ^ uVar16;
        uVar32 = uVar32 ^ uVar9 ^ uVar36;
        uVar37 = uVar37 ^ uVar35;
        uVar35 = uVar35 ^ uVar25 ^ uVar7 & uVar29;
        uVar22 = uVar29 & (uVar39 ^ uVar10) ^ uVar20 ^ uVar11;
        uVar11 = uVar30 & uVar24 ^ uVar6 ^ uVar18 ^ uVar11;
        uVar18 = uVar37 ^ uVar18;
        uVar7 = (uVar15 >> 8 ^ uVar15) & 0xcc;
        uVar39 = (uVar7 << 8 | uVar7) ^ uVar15;
        uVar28 = uVar39 >> 4 & 0xaaa;
        uVar7 = (uVar32 >> 8 ^ uVar32) & 0xcc;
        uVar40 = uVar39 & 0x5555 | (uVar39 & 0xfffffffa) << 0xc;
        uVar7 = (uVar7 << 8 | uVar7) ^ uVar32;
        uVar38 = uVar7 >> 4 & 0xaaa;
        uVar39 = (uVar22 >> 8 ^ uVar22) & 0xcc;
        uVar39 = (uVar39 << 8 | uVar39) ^ uVar22;
        uVar20 = uVar7 & 0x5555 | (uVar7 & 0xfffffffa) << 0xc;
        uVar7 = (uVar35 >> 8 ^ uVar35) & 0xcc;
        uVar12 = uVar39 & 0x5555 | (uVar39 & 0xfffffffa) << 0xc;
        uVar7 = (uVar7 << 8 | uVar7) ^ uVar35;
        uVar36 = uVar7 & 0x5555 | (uVar7 & 0xfffffffa) << 0xc;
        uVar16 = (uVar37 >> 8 ^ uVar37) & 0xcc;
        uVar30 = uVar39 >> 4 & 0xaaa;
        uVar26 = uVar7 >> 4 & 0xaaa;
        uVar7 = (uVar16 << 8 | uVar16) ^ uVar37;
        uVar19 = uVar7 >> 4 & 0xaaa;
        uVar23 = uVar7 & 0x5555 | (uVar7 & 0xfffffffa) << 0xc;
        uVar7 = (uVar11 >> 8 ^ uVar11) & 0xcc;
        uVar7 = (uVar7 << 8 | uVar7) ^ uVar11;
        uVar14 = uVar7 & 0x5555 | (uVar7 & 0xfffffffa) << 0xc;
        uVar24 = uVar7 >> 4 & 0xaaa;
        uVar7 = (uVar18 >> 8 ^ uVar18) & 0xcc;
        uVar7 = (uVar7 << 8 | uVar7) ^ uVar18;
        uVar31 = uVar7 & 0x5555 | (uVar7 & 0xfffffffa) << 0xc;
        uVar39 = (uVar34 >> 8 ^ uVar34) & 0xcc;
        uVar25 = uVar7 >> 4 & 0xaaa;
        uVar7 = (uVar39 << 8 | uVar39) ^ uVar34;
        uVar33 = uVar7 & 0x5555 | (uVar7 & 0xfffffffa) << 0xc;
        uVar29 = uVar7 >> 4 & 0xaaa;
        uVar7 = ((uVar40 & 0xeeee | uVar28) >> 1) + (uVar15 & 0xfffff111) * 8;
        uVar39 = ((uVar20 & 0xeeee | uVar38) >> 1) + (uVar32 & 0xfffff111) * 8;
        uVar16 = ((uVar12 & 0xeeee | uVar30) >> 1) + (uVar22 & 0xfffff111) * 8;
        uVar35 = ((uVar36 & 0xeeee | uVar26) >> 1) + (uVar35 & 0xfffff111) * 8;
        uVar22 = ((uVar23 & 0xeeee | uVar19) >> 1) + (uVar37 & 0xfffff111) * 8;
        uVar6 = ((uVar14 & 0xeeee | uVar24) >> 1) + (uVar11 & 0xfffff111) * 8;
        uVar9 = ((uVar31 & 0xeeee | uVar25) >> 1) + (uVar18 & 0xfffff111) * 8;
        uVar10 = ((uVar33 & 0xeeee | uVar29) >> 1) + (uVar34 & 0xfffff111) * 8;
        uVar37 = (uVar40 | uVar28) ^ uVar7;
        uVar28 = (uVar20 | uVar38) ^ uVar39;
        uVar12 = (uVar12 | uVar30) ^ uVar16;
        uVar32 = (uVar33 | uVar29) ^ uVar10;
        uVar11 = (uVar36 | uVar26) ^ uVar35;
        uVar15 = (uVar23 | uVar19) ^ uVar22;
        uVar14 = (uVar14 | uVar24) ^ uVar6;
        uVar31 = (uVar31 | uVar25) ^ uVar9;
        uVar7 = uVar7 ^ uVar32 ^
                (uint)(ushort)((ushort)((uVar37 >> 2 & 0x3333) + (uVar37 & 0x3333) * 4) ^
                              *(ushort *)&psVar27->vt);
        uVar38 = uVar37 ^ uVar39 ^ uVar32 ^
                 (uint)(ushort)((ushort)((uVar28 >> 2 & 0x3333) + (uVar28 & 0x3333) * 4) ^
                               *(ushort *)((long)&psVar27->vt + 2));
        uVar28 = uVar28 ^ uVar16 ^
                 (uint)(ushort)((ushort)((uVar12 >> 2 & 0x3333) + (uVar12 & 0x3333) * 4) ^
                               *(ushort *)((long)&psVar27->vt + 4));
        uVar36 = uVar35 ^ uVar32 ^ uVar12 ^
                 (uint)(ushort)((ushort)((uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4) ^
                               *(ushort *)((long)&psVar27->vt + 6));
        uVar39 = uVar32 ^ uVar22 ^ uVar11 ^
                 (uint)(ushort)((ushort)((uVar15 >> 2 & 0x3333) + (uVar15 & 0x3333) * 4) ^
                               *(ushort *)&psVar27[1].vt);
        uVar16 = uVar15 ^ uVar6 ^
                 (uint)(ushort)((ushort)((uVar14 >> 2 & 0x3333) + (uVar14 & 0x3333) * 4) ^
                               *(ushort *)((long)&psVar27[1].vt + 2));
        uVar22 = uVar14 ^ uVar9 ^
                 (uint)(ushort)((ushort)((uVar31 >> 2 & 0x3333) + (uVar31 & 0x3333) * 4) ^
                               *(ushort *)((long)&psVar27[1].vt + 4));
        uVar35 = uVar31 ^ uVar10 ^
                 (uint)(ushort)((ushort)((uVar32 >> 2 & 0x3333) + (uVar32 & 0x3333) * 4) ^
                               *(ushort *)((long)&psVar27[1].vt + 6));
        psVar27 = psVar27 + 2;
      }
      uVar6 = uVar28 ^ uVar39;
      uVar9 = uVar38 ^ uVar35;
      uVar10 = uVar28 ^ uVar35;
      uVar16 = uVar16 ^ uVar22;
      uVar11 = uVar7 ^ uVar16;
      uVar19 = uVar39 ^ uVar35;
      uVar12 = uVar9 ^ uVar6;
      uVar28 = uVar28 ^ uVar36 ^ uVar12;
      uVar22 = uVar36 ^ uVar12 ^ uVar22;
      uVar23 = uVar28 ^ uVar16;
      uVar29 = uVar22 ^ uVar19;
      uVar14 = (uVar23 ^ uVar29) & uVar6 ^ uVar29 & uVar19;
      uVar31 = uVar23 & uVar10 ^ uVar29 & uVar19;
      uVar38 = uVar38 ^ uVar11;
      uVar16 = uVar16 ^ uVar29;
      uVar36 = uVar22 ^ uVar28 & uVar12 ^ (uVar28 ^ uVar7) & (uVar38 ^ uVar10) ^ uVar14;
      uVar14 = uVar38 & uVar11 ^ uVar16 ^ uVar16 & uVar9 ^ uVar9 ^ uVar14;
      uVar22 = (uVar11 ^ uVar39) & uVar7 ^ uVar10 ^ uVar23 ^ uVar28 & uVar12 ^ uVar31;
      uVar31 = uVar16 & uVar9 ^ uVar35 ^ (uVar29 ^ uVar7) & (uVar11 ^ uVar35) ^ uVar16 ^ uVar31;
      uVar15 = uVar14 & uVar36;
      uVar36 = uVar36 ^ uVar22;
      uVar25 = (uVar31 ^ uVar15) & uVar36 ^ uVar22;
      uVar22 = (uVar22 ^ uVar15) & (uVar31 ^ uVar14);
      uVar33 = uVar22 ^ uVar31;
      uVar22 = (uVar22 ^ uVar15) & uVar31;
      uVar14 = uVar14 ^ uVar22;
      uVar36 = (uVar22 ^ uVar31 ^ uVar15) & uVar25 ^ uVar36;
      uVar20 = uVar14 ^ uVar33;
      uVar18 = uVar36 ^ uVar20;
      uVar24 = uVar20 & (uVar38 ^ uVar10);
      uVar22 = uVar25 ^ uVar33;
      uVar16 = uVar16 & (uVar36 ^ uVar25);
      uVar9 = (uVar36 ^ uVar25) & uVar9;
      uVar30 = (uVar29 ^ uVar7) & uVar25;
      uVar37 = (uVar23 ^ uVar29) & (uVar18 ^ uVar22);
      uVar6 = (uVar18 ^ uVar22) & uVar6;
      uVar38 = uVar36 & uVar38 ^ uVar30;
      uVar32 = uVar28 & uVar14 ^ uVar16;
      uVar29 = uVar29 & uVar22 ^ uVar16 ^ uVar37;
      uVar31 = uVar9 ^ uVar7 & uVar33 ^ uVar32;
      uVar22 = uVar22 & uVar19 ^ uVar6;
      uVar15 = uVar31 ^ uVar38 ^ uVar22;
      uVar22 = uVar22 ^ uVar11 & uVar36;
      uVar23 = uVar23 & uVar18 ^ uVar37 ^ uVar22;
      uVar22 = uVar22 ^ uVar24 ^ uVar14 & uVar12;
      uVar16 = uVar11 & uVar36 ^ uVar29;
      uVar36 = (uVar28 ^ uVar7) & uVar20 ^ uVar22;
      uVar22 = uVar22 ^ uVar29;
      uVar35 = uVar25 & (uVar11 ^ uVar35) ^ uVar31 ^ uVar23;
      uVar23 = uVar23 ^ uVar9 ^ uVar38;
      uVar32 = uVar32 ^ uVar36;
      uVar36 = uVar36 ^ uVar30 ^ uVar7 & uVar33;
      uVar38 = uVar33 & (uVar11 ^ uVar39) ^ uVar24 ^ uVar35;
      uVar7 = uVar32 ^ uVar16;
      uVar35 = uVar18 & uVar10 ^ uVar6 ^ uVar16 ^ uVar35;
      uVar39 = (uVar15 >> 8 ^ uVar15) & 0xcc;
      uVar15 = (uVar39 << 8 | uVar39) ^ uVar15;
      uVar39 = (uVar23 >> 8 ^ uVar23) & 0xcc;
      uVar23 = (uVar39 << 8 | uVar39) ^ uVar23;
      uVar39 = (uVar38 >> 8 ^ uVar38) & 0xcc;
      uVar38 = (uVar39 << 8 | uVar39) ^ uVar38;
      uVar39 = (uVar36 >> 8 ^ uVar36) & 0xcc;
      uVar36 = (uVar39 << 8 | uVar39) ^ uVar36;
      uVar39 = (uVar32 >> 8 ^ uVar32) & 0xcc;
      uVar32 = (uVar39 << 8 | uVar39) ^ uVar32;
      uVar39 = (uVar35 >> 8 ^ uVar35) & 0xcc;
      uVar35 = (uVar39 << 8 | uVar39) ^ uVar35;
      uVar39 = (uVar7 >> 8 ^ uVar7) & 0xcc;
      uVar7 = (uVar39 << 8 | uVar39) ^ uVar7;
      uVar39 = (uVar22 >> 8 ^ uVar22) & 0xcc;
      uVar22 = (uVar39 << 8 | uVar39) ^ uVar22;
      uVar21 = CONCAT62(CONCAT42(CONCAT22(((ushort)uVar22 & 0x5555 |
                                           (ushort)((uVar22 & 0xfffffffa) << 0xc) |
                                          (ushort)(uVar22 >> 4) & 0xaaa) ^
                                          *(ushort *)((long)&psVar27[1].vt + 6),
                                          ((ushort)uVar35 & 0x5555 |
                                           (ushort)((uVar35 & 0xfffffffa) << 0xc) |
                                          (ushort)(uVar35 >> 4) & 0xaaa) ^
                                          *(ushort *)((long)&psVar27[1].vt + 2)),
                                 ((ushort)uVar36 & 0x5555 | (ushort)((uVar36 & 0xfffffffa) << 0xc) |
                                 (ushort)(uVar36 >> 4) & 0xaaa) ^
                                 *(ushort *)((long)&psVar27->vt + 6)),
                        ((ushort)uVar23 & 0x5555 | (ushort)((uVar23 & 0xfffffffa) << 0xc) |
                        (ushort)(uVar23 >> 4) & 0xaaa) ^ *(ushort *)((long)&psVar27->vt + 2));
      uVar8 = CONCAT62(CONCAT42(CONCAT22(((ushort)uVar7 & 0x5555 |
                                          (ushort)((uVar7 & 0xfffffffa) << 0xc) |
                                         (ushort)(uVar7 >> 4) & 0xaaa) ^
                                         *(ushort *)((long)&psVar27[1].vt + 4),
                                         ((ushort)uVar32 & 0x5555 |
                                          (ushort)((uVar32 & 0xfffffffa) << 0xc) |
                                         (ushort)(uVar32 >> 4) & 0xaaa) ^ *(ushort *)&psVar27[1].vt)
                                ,((ushort)uVar38 & 0x5555 | (ushort)((uVar38 & 0xfffffffa) << 0xc) |
                                 (ushort)(uVar38 >> 4) & 0xaaa) ^
                                 *(ushort *)((long)&psVar27->vt + 4)),
                       ((ushort)uVar15 & 0x5555 | (ushort)((uVar15 & 0xfffffffa) << 0xc) |
                       (ushort)(uVar15 >> 4) & 0xaaa) ^ *(ushort *)&psVar27->vt);
      uVar17 = (uVar8 >> 8 ^ uVar21) & 0xff00ff00ff00ff;
      uVar8 = uVar17 << 8 ^ uVar8;
      uVar17 = uVar17 ^ uVar21;
      uVar21 = (ulong)(((uint)(uVar8 >> 0x1c) ^ (uint)uVar8) & 0xf0f0f0f0);
      uVar8 = (uVar21 << 0x1c | uVar21) ^ uVar8;
      uVar21 = (ulong)(((uint)(uVar17 >> 0x1c) ^ (uint)uVar17) & 0xf0f0f0f0);
      uVar17 = (uVar21 << 0x1c | uVar21) ^ uVar17;
      uVar8 = ((uVar8 >> 0xe ^ uVar8) & 0xcccc0000cccc) * 0x4001 ^ uVar8;
      uVar17 = ((uVar17 >> 0xe ^ uVar17) & 0xcccc0000cccc) * 0x4001 ^ uVar17;
      uVar8 = ((uVar8 >> 7 ^ uVar8) & 0xaa00aa00aa00aa) * 0x81 ^ uVar8;
      uVar17 = ((uVar17 >> 7 ^ uVar17) & 0xaa00aa00aa00aa) * 0x81 ^ uVar17;
      *(char *)&ciph[-0xb].vt = (char)uVar8;
      *(char *)((long)&ciph[-0xb].vt + 1) = (char)(uVar8 >> 8);
      *(char *)((long)&ciph[-0xb].vt + 2) = (char)(uVar8 >> 0x10);
      *(char *)((long)&ciph[-0xb].vt + 3) = (char)(uVar8 >> 0x18);
      *(char *)((long)&ciph[-0xb].vt + 4) = (char)(uVar8 >> 0x20);
      *(char *)((long)&ciph[-0xb].vt + 5) = (char)(uVar8 >> 0x28);
      *(char *)((long)&ciph[-0xb].vt + 6) = (char)(uVar8 >> 0x30);
      *(char *)((long)&ciph[-0xb].vt + 7) = (char)(uVar8 >> 0x38);
      *(char *)&ciph[-10].vt = (char)uVar17;
      *(char *)((long)&ciph[-10].vt + 1) = (char)(uVar17 >> 8);
      *(char *)((long)&ciph[-10].vt + 2) = (char)(uVar17 >> 0x10);
      *(char *)((long)&ciph[-10].vt + 3) = (char)(uVar17 >> 0x18);
      *(char *)((long)&ciph[-10].vt + 4) = (char)(uVar17 >> 0x20);
      *(char *)((long)&ciph[-10].vt + 5) = (char)(uVar17 >> 0x28);
      *(char *)((long)&ciph[-10].vt + 6) = (char)(uVar17 >> 0x30);
      *(char *)((long)&ciph[-10].vt + 7) = (char)(uVar17 >> 0x38);
      psVar2 = ciph[-10].vt;
      *(ssh_cipheralg **)vblk = vout->vt;
      *(ssh_cipheralg **)((long)vblk + 8) = psVar2;
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < puVar13);
  }
  return;
}

Assistant:

static inline void aes_cbc_sw_encrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * CBC encryption has to be done serially, because the input to
     * each run of the cipher includes the output from the previous
     * run.
     */

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        /*
         * We use the IV array itself as the location for the
         * encryption, because there's no reason not to.
         */

        /* XOR the new plaintext block into the previous cipher block */
        memxor16(ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, blk);

        /* Run the cipher over the result, which leaves it
         * conveniently already stored in ctx->iv */
        aes_sliced_e_serial(
            ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, &ctx->sk);

        /* Copy it to the output location */
        memcpy(blk, ctx->iv.cbc.prevblk, 16);
    }
}